

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SField.cpp
# Opt level: O1

void __thiscall jbcoin::SField::SField(SField *this,int fc)

{
  this->fieldCode = fc;
  this->fieldType = STI_UNKNOWN;
  this->fieldValue = 0;
  (this->fieldName)._M_dataplus._M_p = (pointer)&(this->fieldName).field_2;
  (this->fieldName)._M_string_length = 0;
  (this->fieldName).field_2._M_local_buf[0] = '\0';
  this->fieldMeta = 0;
  num = num + 1;
  this->fieldNum = num;
  this->signingField = yes;
  getName_abi_cxx11_(&this->jsonName,this);
  return;
}

Assistant:

SField::SField (int fc)
    : fieldCode (fc)
    , fieldType (STI_UNKNOWN)
    , fieldValue (0)
    , fieldMeta (sMD_Never)
    , fieldNum (++num)
    , signingField (IsSigning::yes)
    , jsonName (getName ())
{
}